

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

void stat_unregister(nni_stat_item *item)

{
  nni_stat_item *item_00;
  
  while( true ) {
    item_00 = (nni_stat_item *)nni_list_first(&item->si_children);
    if (item_00 == (nni_stat_item *)0x0) break;
    stat_unregister(item_00);
  }
  if (((item->si_info->field_0x18 & 2) != 0) && (item->si_info->si_type == NNG_STAT_STRING)) {
    nni_strfree((item->si_u).sv_string);
    (item->si_u).sv_number = 0;
  }
  nni_list_node_remove(&item->si_node);
  return;
}

Assistant:

void
stat_unregister(nni_stat_item *item)
{
	nni_stat_item *child;
	while ((child = nni_list_first(&item->si_children)) != NULL) {
		stat_unregister(child);
	}
	if ((item->si_info->si_alloc) &&
	    (item->si_info->si_type == NNG_STAT_STRING)) {
		nni_strfree(item->si_u.sv_string);
		item->si_u.sv_string = NULL;
	}
	nni_list_node_remove(&item->si_node);
}